

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_projection.hpp
# Opt level: O0

Matrix4<float> *
eos::render::ortho<float>
          (Matrix4<float> *__return_storage_ptr__,float left,float right,float bottom,float top)

{
  Scalar *pSVar1;
  float fVar2;
  float fVar3;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_23 [3];
  float local_20;
  float local_1c;
  float top_local;
  float bottom_local;
  float right_local;
  float left_local;
  Matrix4<float> *result;
  
  local_20 = top;
  local_1c = bottom;
  top_local = right;
  bottom_local = left;
  _right_local = __return_storage_ptr__;
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::Matrix<float,4,4,0,4,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            ((Matrix<float,4,4,0,4,4> *)__return_storage_ptr__,local_23);
  fVar2 = top_local - bottom_local;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1> *)
                      __return_storage_ptr__,0,0);
  *pSVar1 = 2.0 / fVar2;
  fVar2 = local_20 - local_1c;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1> *)
                      __return_storage_ptr__,1,1);
  *pSVar1 = 2.0 / fVar2;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1> *)
                      __return_storage_ptr__,2,2);
  *pSVar1 = -1.0;
  fVar2 = top_local + bottom_local;
  fVar3 = top_local - bottom_local;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1> *)
                      __return_storage_ptr__,0,3);
  *pSVar1 = -fVar2 / fVar3;
  fVar2 = local_20 + local_1c;
  fVar3 = local_20 - local_1c;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1> *)
                      __return_storage_ptr__,1,3);
  *pSVar1 = -fVar2 / fVar3;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix4<T> ortho(T left, T right, T bottom, T top)
{
    Eigen::Matrix4<T> result = Eigen::Matrix4<T>::Identity();
    result(0, 0) = static_cast<T>(2) / (right - left);
    result(1, 1) = static_cast<T>(2) / (top - bottom);
    result(2, 2) = -static_cast<T>(1);
    result(0, 3) = -(right + left) / (right - left);
    result(1, 3) = -(top + bottom) / (top - bottom);
    return result;
}